

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

Value * __thiscall
wabt::Decompiler::WrapNAry
          (Value *__return_storage_ptr__,Decompiler *this,
          vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *args,
          string_view prefix,string_view postfix,Precedence precedence)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pVVar2;
  pointer pbVar3;
  pointer pbVar4;
  const_iterator __position;
  char *pcVar5;
  long lVar6;
  size_t amount;
  Value *child_1;
  pointer pVVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  bool bVar8;
  pointer pVVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  pointer pbVar13;
  ulong uVar14;
  string_view first_indent;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *__range3;
  string s_1;
  string_view local_a8;
  string local_98;
  pointer local_70;
  char *local_68;
  size_type local_60;
  char local_58 [8];
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_a8.size_ = prefix.size_;
  local_a8.data_ = prefix.data_;
  pVVar7 = (args->
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (args->
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar7 == pVVar2) {
    uVar12 = 0;
    bVar8 = false;
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    bVar8 = false;
    uVar12 = 0;
    pVVar9 = pVVar7;
    do {
      pbVar4 = (pVVar9->v).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar11 = 0;
      pbVar3 = (pVVar9->v).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pbVar13 = pbVar3; pbVar13 != pbVar4; pbVar13 = pbVar13 + 1) {
        if (uVar11 <= pbVar13->_M_string_length) {
          uVar11 = pbVar13->_M_string_length;
        }
      }
      if (uVar12 <= uVar11) {
        uVar12 = uVar11;
      }
      lVar6 = lVar6 + uVar11;
      bVar8 = (bool)(bVar8 | 0x20U < (ulong)((long)pbVar4 - (long)pbVar3));
      pVVar9 = pVVar9 + 1;
    } while (pVVar9 != pVVar2);
  }
  if ((bVar8) ||
     (this->target_exp_width <= lVar6 + local_a8.size_ + postfix.size_ && pVVar7 != pVVar2)) {
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_98);
    __return_storage_ptr__->precedence = precedence;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_98);
    uVar12 = uVar12 + local_a8.size_;
    uVar11 = this->target_exp_width;
    pVVar7 = (args->
             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_70 = (args->
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (pVVar7 != local_70) {
      uVar14 = 0;
      do {
        amount = local_a8.size_;
        if (uVar11 <= uVar12) {
          amount = this->indent_amount;
        }
        pcVar5 = local_a8.data_;
        sVar10 = local_a8.size_;
        if (uVar14 != 0 || uVar11 <= uVar12) {
          pcVar5 = (char *)0x0;
          sVar10 = 0;
        }
        first_indent.size_ = sVar10;
        first_indent.data_ = pcVar5;
        IndentValue(this,pVVar7,amount,first_indent);
        if (uVar14 < ((long)(args->
                            super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
          std::__cxx11::string::append
                    ((char *)((pVVar7->v).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1));
        }
        __args = (pVVar7->v).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = (long)(pVVar7->v).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)__args >> 5;
        if (0 < lVar6) {
          lVar6 = lVar6 + 1;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr__,__args);
            __args = __args + 1;
            lVar6 = lVar6 + -1;
          } while (1 < lVar6);
        }
        uVar14 = uVar14 + 1;
        pVVar7 = pVVar7 + 1;
      } while (pVVar7 != local_70);
    }
    if (uVar11 <= uVar12) {
      __position._M_current =
           (__return_storage_ptr__->v).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      string_view::operator_cast_to_string(&local_98,&local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&__return_storage_ptr__->v,__position,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
    std::__cxx11::string::append
              ((char *)((__return_storage_ptr__->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),(ulong)postfix.data_);
  }
  else {
    string_view::operator_cast_to_string(&local_98,&local_a8);
    pVVar7 = (args->
             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar2 = (args->
             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pVVar7 != pVVar2) {
      do {
        if (pVVar7 != (args->
                      super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                      )._M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::append((char *)&local_98);
        }
        std::__cxx11::string::_M_append
                  ((char *)&local_98,
                   (ulong)(((pVVar7->v).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        pVVar7 = pVVar7 + 1;
      } while (pVVar7 != pVVar2);
    }
    std::__cxx11::string::append((char *)&local_98,(ulong)postfix.data_);
    paVar1 = &local_98.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar1) {
      uStack_50 = local_98.field_2._8_8_;
      local_68 = local_58;
    }
    else {
      local_68 = local_98._M_dataplus._M_p;
    }
    local_60 = local_98._M_string_length;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity =
         local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               &local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_48);
    __return_storage_ptr__->precedence = precedence;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value WrapNAry(std::vector<Value>& args, string_view prefix,
                 string_view postfix, Precedence precedence) {
    size_t total_width = 0;
    size_t max_width = 0;
    bool multiline = false;
    for (auto& child : args) {
      auto w = child.width();
      max_width = std::max(max_width, w);
      total_width += w;
      multiline = multiline || child.v.size() > 1;
    }
    if (!multiline &&
        (total_width + prefix.size() + postfix.size() < target_exp_width ||
         args.empty())) {
      // Single line.
      auto s = std::string(prefix);
      for (auto& child : args) {
        if (&child != &args[0])
          s += ", ";
        s += child.v[0];
      }
      s += postfix;
      return Value{{std::move(s)}, precedence};
    } else {
      // Multi-line.
      Value ml { {}, precedence };
      auto ident_with_name = max_width + prefix.size() < target_exp_width;
      size_t i = 0;
      for (auto& child : args) {
        IndentValue(child, ident_with_name ? prefix.size() : indent_amount,
                    !i && ident_with_name ? prefix : string_view {});
        if (i < args.size() - 1) child.v.back() += ",";
        std::move(child.v.begin(), child.v.end(),
                  std::back_inserter(ml.v));
        i++;
      }
      if (!ident_with_name) ml.v.insert(ml.v.begin(), std::string(prefix));
      ml.v.back() += postfix;
      return ml;
    }
  }